

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O1

Argument * __thiscall
argparse::ArgumentParser::operator[](ArgumentParser *this,string_view aArgumentName)

{
  iterator iVar1;
  logic_error *this_00;
  key_type local_20;
  
  local_20._M_str = aArgumentName._M_str;
  local_20._M_len = aArgumentName._M_len;
  iVar1 = std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
          ::find(&(this->mArgumentMap)._M_t,&local_20);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header)
  {
    return (Argument *)&(iVar1._M_node[1]._M_left)->_M_left;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"No such argument");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Argument &operator[](std::string_view aArgumentName) {
    auto tIterator = mArgumentMap.find(aArgumentName);
    if (tIterator != mArgumentMap.end()) {
      return *(tIterator->second);
    }
    throw std::logic_error("No such argument");
  }